

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::noteDefaultClocking
          (Compilation *this,Scope *scope,Symbol *clocking,SourceRange range)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  value_type_pointer ppVar4;
  int iVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  ulong pos0;
  Diagnostic *this_00;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong hash;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  try_emplace_args_t local_81;
  flat_hash_map<const_Symbol_*,_const_Symbol_*> *local_80;
  Symbol *local_78;
  Symbol *inst;
  ulong local_68;
  group_type_pointer local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator res;
  
  bVar7 = Scope::isUninstantiated(scope);
  if ((!bVar7) && (inst = Scope::getContainingInstanceOrChecker(scope), inst != (Symbol *)0x0)) {
    local_80 = &this->defaultClockingMap;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = inst;
    hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(this->defaultClockingMap).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
                          .arrays.groups_size_index & 0x3f);
    local_60 = (this->defaultClockingMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
               .arrays.groups_;
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    ppVar4 = (this->defaultClockingMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
             .arrays.elements_;
    local_68 = (this->defaultClockingMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
               .arrays.groups_size_mask;
    uVar11 = 0;
    uVar10 = pos0;
    do {
      pgVar2 = local_60 + uVar10;
      local_58 = pgVar2->m[0].n;
      uStack_57 = pgVar2->m[1].n;
      uStack_56 = pgVar2->m[2].n;
      bStack_55 = pgVar2->m[3].n;
      uStack_54 = pgVar2->m[4].n;
      uStack_53 = pgVar2->m[5].n;
      uStack_52 = pgVar2->m[6].n;
      bStack_51 = pgVar2->m[7].n;
      uStack_50 = pgVar2->m[8].n;
      uStack_4f = pgVar2->m[9].n;
      uStack_4e = pgVar2->m[10].n;
      bStack_4d = pgVar2->m[0xb].n;
      uStack_4c = pgVar2->m[0xc].n;
      uStack_4b = pgVar2->m[0xd].n;
      uStack_4a = pgVar2->m[0xe].n;
      bStack_49 = pgVar2->m[0xf].n;
      uVar12 = (uchar)uVar3;
      auVar16[0] = -(local_58 == uVar12);
      uVar13 = (uchar)((uint)uVar3 >> 8);
      auVar16[1] = -(uStack_57 == uVar13);
      uVar14 = (uchar)((uint)uVar3 >> 0x10);
      auVar16[2] = -(uStack_56 == uVar14);
      bVar15 = (byte)((uint)uVar3 >> 0x18);
      auVar16[3] = -(bStack_55 == bVar15);
      auVar16[4] = -(uStack_54 == uVar12);
      auVar16[5] = -(uStack_53 == uVar13);
      auVar16[6] = -(uStack_52 == uVar14);
      auVar16[7] = -(bStack_51 == bVar15);
      auVar16[8] = -(uStack_50 == uVar12);
      auVar16[9] = -(uStack_4f == uVar13);
      auVar16[10] = -(uStack_4e == uVar14);
      auVar16[0xb] = -(bStack_4d == bVar15);
      auVar16[0xc] = -(uStack_4c == uVar12);
      auVar16[0xd] = -(uStack_4b == uVar13);
      auVar16[0xe] = -(uStack_4a == uVar14);
      auVar16[0xf] = -(bStack_49 == bVar15);
      for (uVar8 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
          local_78 = clocking, uVar8 != 0; uVar8 = uVar8 - 1 & uVar8) {
        iVar5 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
          }
        }
        if (inst == *(Symbol **)((long)&ppVar4[uVar10 * 0xf].first + (ulong)(uint)(iVar5 << 4))) {
          this_00 = Scope::addDiag(scope,(DiagCode)0x15000d,range);
          Diagnostic::addNote(this_00,(DiagCode)0xa0001,
                              *(SourceLocation *)
                               (*(long *)((long)&ppVar4[uVar10 * 0xf].second +
                                         (ulong)(uint)(iVar5 << 4)) + 0x18));
          return;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_49) == 0) break;
      lVar9 = uVar10 + uVar11;
      uVar11 = uVar11 + 1;
      uVar10 = lVar9 + 1U & local_68;
    } while (uVar11 <= local_68);
    if ((this->defaultClockingMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
        .size_ctrl.size <
        (this->defaultClockingMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Symbol_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,slang::ast::Symbol_const*>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Symbol_const*>>>
                       *)local_80,(arrays_type *)local_80,pos0,hash,&local_81,&inst,&local_78);
      psVar1 = &(this->defaultClockingMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Symbol_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,slang::ast::Symbol_const*>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Symbol_const*>>>
                       *)local_80,hash,&local_81,&inst,&local_78);
    }
  }
  return;
}

Assistant:

void Compilation::noteDefaultClocking(const Scope& scope, const Symbol& clocking,
                                      SourceRange range) {
    SLANG_ASSERT(!isFrozen());

    if (scope.isUninstantiated())
        return;

    // The LRM is not clear about this, but this Accellera issue states
    // that default clocking declarations inside child scopes actually
    // belong to the parent instance body. Only VCS implements this correctly,
    // other tools treat it the way you'd naturally expect.
    // https://accellera.mantishub.io/view.php?id=3515

    auto inst = scope.getContainingInstanceOrChecker();
    if (inst) {
        auto [it, inserted] = defaultClockingMap.emplace(inst, &clocking);
        if (!inserted) {
            auto& diag = scope.addDiag(diag::MultipleDefaultClocking, range);
            diag.addNote(diag::NotePreviousDefinition, it->second->location);
        }
    }
}